

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.h
# Opt level: O3

RegSlot __thiscall
Js::AsmJSByteCodeGenerator::GetAndReleaseBinaryLocations<float>
          (AsmJSByteCodeGenerator *this,EmitExpressionInfo *lhs,EmitExpressionInfo *rhs)

{
  RegSlot RVar1;
  AsmJsFunc *pAVar2;
  bool bVar3;
  Types TVar4;
  RegSlot RVar5;
  RegisterSpace *pRVar6;
  
  pAVar2 = this->mFunction;
  TVar4 = WAsmJs::FromPrimitiveType<float>();
  pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar2->mTypedRegisterAllocator,TVar4);
  if (((lhs == (EmitExpressionInfo *)0x0) ||
      (RVar5 = (lhs->super_EmitInfoBase).location, RVar5 == 0xffffffff)) ||
     (bVar3 = WAsmJs::RegisterSpace::IsTmpReg(pRVar6,RVar5), !bVar3)) {
    pAVar2 = this->mFunction;
    TVar4 = WAsmJs::FromPrimitiveType<float>();
    pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                       (&pAVar2->mTypedRegisterAllocator,TVar4);
    if (((rhs == (EmitExpressionInfo *)0x0) ||
        (RVar5 = (rhs->super_EmitInfoBase).location, RVar5 == 0xffffffff)) ||
       (bVar3 = WAsmJs::RegisterSpace::IsTmpReg(pRVar6,RVar5), !bVar3)) {
      pAVar2 = this->mFunction;
      TVar4 = WAsmJs::FromPrimitiveType<float>();
      pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar4);
      RVar5 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar6);
      pAVar2 = this->mFunction;
      TVar4 = WAsmJs::FromPrimitiveType<float>();
      pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar4);
      if ((rhs != (EmitExpressionInfo *)0x0) &&
         (RVar1 = (rhs->super_EmitInfoBase).location, RVar1 != 0xffffffff)) {
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar6,RVar1);
      }
      pAVar2 = this->mFunction;
      TVar4 = WAsmJs::FromPrimitiveType<float>();
      pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar4);
      if (lhs == (EmitExpressionInfo *)0x0) {
        return RVar5;
      }
      RVar1 = (lhs->super_EmitInfoBase).location;
    }
    else {
      RVar5 = (rhs->super_EmitInfoBase).location;
      pAVar2 = this->mFunction;
      TVar4 = WAsmJs::FromPrimitiveType<float>();
      pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar4);
      if (lhs == (EmitExpressionInfo *)0x0) {
        return RVar5;
      }
      RVar1 = (lhs->super_EmitInfoBase).location;
    }
  }
  else {
    RVar5 = (lhs->super_EmitInfoBase).location;
    pAVar2 = this->mFunction;
    TVar4 = WAsmJs::FromPrimitiveType<float>();
    pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                       (&pAVar2->mTypedRegisterAllocator,TVar4);
    if (rhs == (EmitExpressionInfo *)0x0) {
      return RVar5;
    }
    RVar1 = (rhs->super_EmitInfoBase).location;
  }
  if (RVar1 != 0xffffffff) {
    WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar6,RVar1);
  }
  return RVar5;
}

Assistant:

RegSlot GetAndReleaseBinaryLocations( const EmitExpressionInfo* lhs, const EmitExpressionInfo* rhs )
        {
            RegSlot tmpRegToUse;
            if( mFunction->IsTmpLocation<T>( lhs ) )
            {
                tmpRegToUse = lhs->location;
                mFunction->ReleaseLocation<T>( rhs );
            }
            else if( mFunction->IsTmpLocation<T>( rhs ) )
            {
                tmpRegToUse = rhs->location;
                mFunction->ReleaseLocation<T>( lhs );
            }
            else
            {
                tmpRegToUse = mFunction->AcquireTmpRegister<T>();
                mFunction->ReleaseLocation<T>( rhs );
                mFunction->ReleaseLocation<T>( lhs );
            }
            return tmpRegToUse;
        }